

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

void __thiscall QTcpServer::addPendingConnection(QTcpServer *this,QTcpSocket *socket)

{
  QTcpServer *in_RDI;
  parameter_type in_stack_ffffffffffffffd8;
  
  d_func((QTcpServer *)0x263221);
  QList<QTcpSocket_*>::append((QList<QTcpSocket_*> *)0x263235,in_stack_ffffffffffffffd8);
  pendingConnectionAvailable(in_RDI);
  return;
}

Assistant:

void QTcpServer::addPendingConnection(QTcpSocket* socket)
{
    d_func()->pendingConnections.append(socket);
    emit pendingConnectionAvailable(QPrivateSignal());
}